

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_unshuffle_2bytes(char *heap,LONGLONG length,int *status)

{
  int extraout_EAX;
  void *__src;
  long lVar1;
  long lVar2;
  
  __src = malloc(length * 2);
  lVar1 = 0;
  lVar2 = 0;
  if (0 < length) {
    lVar2 = length;
  }
  for (; -lVar1 != lVar2; lVar1 = lVar1 + -1) {
    *(char *)((long)__src + lVar1 * 2 + length * 2 + -1) = heap[lVar1 + length * 2 + -1];
    *(char *)((long)__src + lVar1 * 2 + length * 2 + -2) = heap[lVar1 + length + -1];
  }
  memcpy(heap,__src,length * 2);
  free(__src);
  return extraout_EAX;
}

Assistant:

static int fits_unshuffle_2bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 2-byte integers */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 2));
    heapptr = heap + (2 * length) - 1;
    cptr = ptr + (2 * length) - 1;
    
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       heapptr--;
    }
         
    memcpy(heap, ptr, (size_t) (length * 2));
    free(ptr);
    return(*status);
}